

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

QHeaderView * __thiscall QAccessibleTableHeaderCell::headerView(QAccessibleTableHeaderCell *this)

{
  QTableView *this_00;
  QHeaderView *pQVar1;
  QTreeView *this_01;
  
  this_00 = (QTableView *)QMetaObject::cast((QObject *)&QTableView::staticMetaObject);
  if (this_00 != (QTableView *)0x0) {
    if (this->orientation != Horizontal) {
      pQVar1 = QTableView::verticalHeader(this_00);
      return pQVar1;
    }
    pQVar1 = QTableView::horizontalHeader(this_00);
    return pQVar1;
  }
  this_01 = (QTreeView *)QMetaObject::cast((QObject *)&QTreeView::staticMetaObject);
  if (this_01 == (QTreeView *)0x0) {
    return (QHeaderView *)0x0;
  }
  pQVar1 = QTreeView::header(this_01);
  return pQVar1;
}

Assistant:

QHeaderView *QAccessibleTableHeaderCell::headerView() const
{
    QHeaderView *header = nullptr;
    if (false) {
#if QT_CONFIG(tableview)
    } else if (const QTableView *tv = qobject_cast<const QTableView*>(view)) {
        if (orientation == Qt::Horizontal) {
            header = tv->horizontalHeader();
        } else {
            header = tv->verticalHeader();
        }
#endif
#if QT_CONFIG(treeview)
    } else if (const QTreeView *tv = qobject_cast<const QTreeView*>(view)) {
        header = tv->header();
#endif
    }
    return header;
}